

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseRanges(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  Parsekey PVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  iterator iVar8;
  HighsInt HVar9;
  HMpsFF *pHVar10;
  double dVar11;
  double dVar12;
  bool skip;
  bool is_nan;
  string word_1;
  size_t end;
  string marker;
  bool is_nan_1;
  string strline;
  string word;
  size_t begin;
  Parsekey local_140;
  bool local_139;
  HighsLogOptions *local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  string local_110;
  HMpsFF *local_f0;
  undefined1 local_e8 [32];
  double local_c8;
  string local_c0;
  vector<bool,_std::allocator<bool>_> *local_a0;
  string local_98;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  pHVar10 = (HMpsFF *)&this->has_row_entry_;
  local_138 = log_options;
  local_a0 = (vector<bool,_std::allocator<bool>_> *)pHVar10;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)pHVar10,(long)this->num_row,false);
  local_f0 = (HMpsFF *)&this->rowname2idx;
  local_120 = 1;
  local_118 = 0;
  local_130 = 1;
  local_128 = 0;
  while( true ) {
    do {
      bVar2 = getMpsLine(pHVar10,file,&local_78,&local_139);
      if (!bVar2) {
        local_140 = kFail;
        goto LAB_001f78c1;
      }
    } while (local_139 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar6 = std::chrono::_V2::system_clock::now(),
       dVar11 = (double)lVar6 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar11 && dVar11 != this->time_limit_)) break;
    local_e8._0_8_ = local_e8 + 0x10;
    local_e8._8_8_ = (char *)0x0;
    local_e8[0x10] = '\0';
    PVar4 = checkFirstWord(this,&local_78,&local_38,(size_t *)&local_c8,(string *)local_e8);
    dVar11 = local_c8;
    if (PVar4 == kNone) {
      first_word(&local_c0,&local_78,(size_t)local_c8);
      sVar7 = first_word_end(&local_78,(size_t)dVar11);
      HVar9 = 0x3cbf27;
      std::__cxx11::string::_M_replace((ulong)local_e8,0,(char *)local_e8._8_8_,0x3cbf27);
      first_word(&local_110,&local_78,sVar7);
      std::__cxx11::string::operator=((string *)local_e8,(string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(char)local_110._M_dataplus._M_p) !=
          &local_110.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_110._M_dataplus._M_p._1_7_,(char)local_110._M_dataplus._M_p))
        ;
      }
      dVar11 = (double)first_word_end(&local_78,sVar7);
      local_c8 = dVar11;
      iVar5 = std::__cxx11::string::compare(local_e8);
      if (iVar5 == 0) {
        trim(&local_c0,&default_non_chars_abi_cxx11_);
        local_140 = kFail;
        bVar2 = false;
        highsLogUser(local_138,kError,"No range given for row \"%s\"\n",local_c0._M_dataplus._M_p);
      }
      else {
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_f0,&local_c0);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_128 = local_128 + 1;
          if (local_128 % local_130 == 0) {
            highsLogUser(local_138,kWarning,
                         "Row name \"%s\" in RANGES section is not defined: ignored\n",
                         local_c0._M_dataplus._M_p);
LAB_001f7540:
            local_130 = local_130 * 2;
          }
        }
        else {
          pHVar10 = local_f0;
          iVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_f0,&local_c0);
          uVar1 = *(uint *)((long)iVar8.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                  ._M_cur + 0x28);
          if ((int)uVar1 < 0) {
            local_128 = local_128 + 1;
            if (local_128 % local_130 == 0) {
              highsLogUser(local_138,kWarning,
                           "Row name \"%s\" in RANGES section is not valid: ignored\n",
                           local_c0._M_dataplus._M_p);
              goto LAB_001f7540;
            }
          }
          else {
            local_110._M_dataplus._M_p._0_1_ = '\0';
            dVar12 = getValue(pHVar10,(string *)local_e8,(bool *)&local_110,HVar9);
            if ((*(ulong *)(*(long *)&(local_a0->super__Bvector_base<std::allocator<bool>_>)._M_impl
                                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                           (ulong)(uVar1 >> 6) * 8) >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
              if ((char)local_110._M_dataplus._M_p == '\x01') {
                highsLogUser(local_138,kError,"Range for row \"%s\" is NaN\n",
                             local_c0._M_dataplus._M_p);
                local_140 = kFail;
                bVar2 = false;
                goto LAB_001f7870;
              }
              parseRanges::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)this,dVar12,(HighsInt *)(ulong)uVar1);
            }
            else {
              local_118 = local_118 + 1;
              if (local_118 % local_120 == 0) {
                highsLogUser(local_138,kWarning,
                             "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n",
                             local_c0._M_dataplus._M_p);
                local_120 = local_120 * 2;
              }
            }
          }
        }
        bVar3 = is_end(&local_78,(size_t)dVar11,&default_non_chars_abi_cxx11_);
        bVar2 = true;
        if (!bVar3) {
          first_word(&local_110,&local_78,(size_t)dVar11);
          sVar7 = first_word_end(&local_78,(size_t)dVar11);
          HVar9 = 0x3cbf27;
          std::__cxx11::string::_M_replace((ulong)local_e8,0,(char *)local_e8._8_8_,0x3cbf27);
          first_word(&local_98,&local_78,sVar7);
          std::__cxx11::string::operator=((string *)local_e8,(string *)&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
              &local_98.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p
                                    ));
          }
          dVar11 = (double)first_word_end(&local_78,sVar7);
          local_c8 = dVar11;
          iVar5 = std::__cxx11::string::compare(local_e8);
          if (iVar5 == 0) {
            trim(&local_110,&default_non_chars_abi_cxx11_);
            local_140 = kFail;
            bVar2 = false;
            highsLogUser(local_138,kError,"No range given for row \"%s\"\n",
                         CONCAT71(local_110._M_dataplus._M_p._1_7_,(char)local_110._M_dataplus._M_p)
                        );
          }
          else {
            iVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_f0,&local_110);
            if (iVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_128 = local_128 + 1;
              if (local_128 % local_130 == 0) {
                highsLogUser(local_138,kWarning,
                             "Row name \"%s\" in RANGES section is not defined: ignored\n",
                             CONCAT71(local_110._M_dataplus._M_p._1_7_,
                                      (char)local_110._M_dataplus._M_p));
LAB_001f77bc:
                local_130 = local_130 * 2;
              }
            }
            else {
              pHVar10 = local_f0;
              iVar8 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_f0,&local_110);
              uVar1 = *(uint *)((long)iVar8.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                      ._M_cur + 0x28);
              if ((int)uVar1 < 0) {
                local_128 = local_128 + 1;
                if (local_128 % local_130 == 0) {
                  highsLogUser(local_138,kWarning,
                               "Row name \"%s\" in RANGES section is not valid: ignored\n",
                               CONCAT71(local_110._M_dataplus._M_p._1_7_,
                                        (char)local_110._M_dataplus._M_p));
                  goto LAB_001f77bc;
                }
              }
              else {
                local_98._M_dataplus._M_p._0_1_ = '\0';
                dVar12 = getValue(pHVar10,(string *)local_e8,(bool *)&local_98,HVar9);
                if ((*(ulong *)(*(long *)&(local_a0->super__Bvector_base<std::allocator<bool>_>).
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base + (ulong)(uVar1 >> 6) * 8) >>
                     ((ulong)uVar1 & 0x3f) & 1) == 0) {
                  if ((char)local_98._M_dataplus._M_p == '\x01') {
                    highsLogUser(local_138,kError,"Range for row \"%s\" is NaN\n",
                                 CONCAT71(local_110._M_dataplus._M_p._1_7_,
                                          (char)local_110._M_dataplus._M_p));
                    local_140 = kFail;
                    bVar2 = false;
                    goto LAB_001f785c;
                  }
                  parseRanges::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)this,dVar12,(HighsInt *)(ulong)uVar1);
                }
                else {
                  local_118 = local_118 + 1;
                  if (local_118 % local_120 == 0) {
                    highsLogUser(local_138,kWarning,
                                 "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n"
                                 ,CONCAT71(local_110._M_dataplus._M_p._1_7_,
                                           (char)local_110._M_dataplus._M_p));
                    local_120 = local_120 * 2;
                  }
                }
              }
            }
            bVar3 = is_end(&local_78,(size_t)dVar11,&default_non_chars_abi_cxx11_);
            bVar2 = true;
            if (!bVar3) {
              trim(&local_110,&default_non_chars_abi_cxx11_);
              local_140 = kFail;
              bVar2 = false;
              highsLogUser(local_138,kError,"Unknown specifiers in RANGES section for row \"%s\"\n",
                           CONCAT71(local_110._M_dataplus._M_p._1_7_,
                                    (char)local_110._M_dataplus._M_p));
            }
          }
LAB_001f785c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(char)local_110._M_dataplus._M_p) !=
              &local_110.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_110._M_dataplus._M_p._1_7_,
                                     (char)local_110._M_dataplus._M_p));
          }
        }
      }
LAB_001f7870:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    else {
      this->warning_issued_ = local_128 != 0 || local_118 != 0;
      if (local_128 != 0 || local_118 != 0) {
        highsLogUser(local_138,kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d duplicate values\n",
                     local_128,local_118);
      }
      bVar2 = false;
      highsLogDev(local_138,kInfo,"readMPS: Read RANGES  OK\n");
      local_140 = PVar4;
    }
    pHVar10 = (HMpsFF *)local_e8._0_8_;
    if ((HMpsFF *)local_e8._0_8_ != (HMpsFF *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (!bVar2) {
LAB_001f78c1:
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      return local_140;
    }
  }
  local_140 = kTimeout;
  goto LAB_001f78c1;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRanges(const HighsLogOptions& log_options,
                                     std::istream& file) {
  std::string strline, word;

  auto parseName = [this](const std::string& name, HighsInt& rowidx) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);
  };

  auto addRhs = [this](double val, HighsInt& rowidx) {
    if ((row_type[rowidx] == Boundtype::kEq && val < 0) ||
        row_type[rowidx] == Boundtype::kLe) {
      assert(row_upper.at(rowidx) < kHighsInf);
      row_lower.at(rowidx) = row_upper.at(rowidx) - fabs(val);
    } else if ((row_type[rowidx] == Boundtype::kEq && val > 0) ||
               row_type[rowidx] == Boundtype::kGe) {
      assert(row_lower.at(rowidx) > (-kHighsInf));
      row_upper.at(rowidx) = row_lower.at(rowidx) + fabs(val);
    }
    has_row_entry_[rowidx] = true;
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_range = 0;
  size_t report_ignored_duplicate_range_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin, end;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    if (key != Parsekey::kNone) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_range > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d "
                     "duplicate values\n",
                     int(num_ignored_row_name),
                     int(num_ignored_duplicate_range));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RANGES  OK\n");
      return key;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No range given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);
    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Row name \"%s\" in RANGES section is not defined: ignored\n",
            marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      parseName(marker, rowidx);
      if (rowidx < 0) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not valid: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        bool is_nan = false;
        double value = getValue(word, is_nan);  // atof(word.c_str());
        if (has_row_entry_[rowidx]) {
          num_ignored_duplicate_range++;
          if (num_ignored_duplicate_range %
                  report_ignored_duplicate_range_frequency ==
              0) {
            highsLogUser(log_options, HighsLogType::kWarning,
                         "Row name \"%s\" in RANGES section has duplicate "
                         "value %g: ignored\n",
                         marker.c_str(), value);
            report_ignored_duplicate_range_frequency *= 2;
          }
        } else {
          if (is_nan) {
            highsLogUser(log_options, HighsLogType::kError,
                         "Range for row \"%s\" is NaN\n", marker.c_str());
            return HMpsFF::Parsekey::kFail;
          }
          addRhs(value, rowidx);
        }
      }
    }

    if (!is_end(strline, end)) {
      std::string marker = first_word(strline, end);
      size_t end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No range given for row \"%s\"\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        parseName(marker, rowidx);
        if (rowidx < 0) {
          num_ignored_row_name++;
          if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
            highsLogUser(
                log_options, HighsLogType::kWarning,
                "Row name \"%s\" in RANGES section is not valid: ignored\n",
                marker.c_str());
            report_ignored_row_name_frequency *= 2;
          }
        } else {
          bool is_nan = false;
          double value = getValue(word, is_nan);  // atof(word.c_str());
          if (has_row_entry_[rowidx]) {
            num_ignored_duplicate_range++;
            if (num_ignored_duplicate_range %
                    report_ignored_duplicate_range_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Row name \"%s\" in RANGES section has duplicate "
                           "value %g: ignored\n",
                           marker.c_str(), value);
              report_ignored_duplicate_range_frequency *= 2;
            }
          } else {
            if (is_nan) {
              highsLogUser(log_options, HighsLogType::kError,
                           "Range for row \"%s\" is NaN\n", marker.c_str());
              return HMpsFF::Parsekey::kFail;
            }
            addRhs(value, rowidx);
          }
        }
      }

      if (!is_end(strline, end)) {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "Unknown specifiers in RANGES section for row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
    }
  }

  return HMpsFF::Parsekey::kFail;
}